

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O0

void __thiscall TemporalPhaseDecodingSynapse::update(TemporalPhaseDecodingSynapse *this)

{
  double dVar1;
  ValueEvent *this_00;
  Index IVar2;
  Scalar *pSVar3;
  reference ppEVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  double s0;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  long *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Scalar *in_stack_ffffffffffffffa8;
  Logging *in_stack_ffffffffffffffb0;
  int local_1c;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x30); local_c = local_c + 1) {
    dVar6 = *(double *)(in_RDI + 0x38);
    dVar1 = *(double *)(*(long *)(in_RDI + 0x18) + 0x10);
    dVar5 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
    if (dVar6 + dVar1 <= dVar5) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      *(double *)(in_RDI + 0x38) =
           *(double *)(*(long *)(in_RDI + 0x18) + 0x10) + *(double *)(in_RDI + 0x38);
    }
    local_1c = 0;
    while( true ) {
      IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (IVar2 <= local_1c) break;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (Index)in_stack_ffffffffffffff98);
      if (*pSVar3 <= 0.0 && *pSVar3 != 0.0) {
        ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)
                             (*(long *)(in_RDI + 8) + 8),(long)local_c);
        if ((*ppEVar4)->type == Spike) {
          ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                              ((vector<Event_*,_std::allocator<Event_*>_> *)
                               (*(long *)(in_RDI + 8) + 8),(long)local_c);
          dVar6 = round(((((*ppEVar4)->eventTime - *(double *)(in_RDI + 0x38)) -
                         *(double *)(in_RDI + 0x48)) / *(double *)(*(long *)(in_RDI + 0x18) + 0x10))
                        * (double)**(int **)(in_RDI + 0x18));
          in_stack_ffffffffffffffa8 = (Scalar *)((dVar6 * 1.0) / (double)**(int **)(in_RDI + 0x18));
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (Index)in_stack_ffffffffffffff98);
          *pSVar3 = (Scalar)in_stack_ffffffffffffffa8;
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (Index)in_stack_ffffffffffffff98);
          in_stack_ffffffffffffffb0 = (Logging *)((*pSVar3 - 0.1) * 1.25);
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (Index)in_stack_ffffffffffffff98);
          *pSVar3 = (Scalar)in_stack_ffffffffffffffb0;
          ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                              ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                               (long)local_c);
          this_00 = (ValueEvent *)*ppEVar4;
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (Index)in_stack_ffffffffffffff98);
          ValueEvent::setValue(this_00,*pSVar3);
        }
      }
      in_stack_ffffffffffffff98 = *(long **)(in_RDI + 0x10);
      in_stack_ffffffffffffffa4 = local_c;
      ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                           (long)local_c);
      (**(code **)(*in_stack_ffffffffffffff98 + 0x28))
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa4,*ppEVar4);
      local_1c = local_1c + 1;
    }
    in_stack_ffffffffffffff94 = local_c;
    std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
              ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),(long)local_c);
    Logging::logValue(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
                      in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                      (double)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
            spikeTimes.setConstant(-1);
            currentWindow += param->window_length_s;
        }
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) < 0 && from_population->output[i]->type == EventType::Spike) {
                
                double s0 = from_population->output[i]->eventTime - currentWindow - phaseOffset;
                s0 = round(s0/param->window_length_s*param->som_frequency);
                spikeTimes(j) = s0 * 1 / (param->som_frequency);
                spikeTimes(j) = (spikeTimes(j) - 0.1) * 1.25;

                static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(j));
            } 
            to_population->setInput(i, output[i]);
        }
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}